

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutAlsa::openPort(MidiOutAlsa *this,uint portNumber,string *portName)

{
  undefined8 *puVar1;
  snd_seq_t *seq;
  undefined8 uVar2;
  string *psVar3;
  snd_seq_port_info_t *__s;
  MidiApi *pMVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  snd_seq_port_info_t *pinfo_00;
  size_t __n;
  ostream *poVar9;
  undefined8 uVar10;
  string *psVar11;
  undefined8 uStack_340;
  snd_seq_port_info_t asStack_338 [8];
  string *local_330;
  string *local_328;
  string *local_320;
  string *local_318;
  string *local_310;
  string *local_308;
  undefined8 local_300;
  string *local_2f8;
  string *local_2f0;
  ostream *local_2e8;
  ostream *local_2e0;
  ostream *local_2d8;
  snd_seq_port_info_t *local_2d0;
  string *local_2c8;
  string *local_2c0;
  string *local_2b8;
  string *local_2b0;
  MidiApi *local_2a8;
  string local_2a0;
  string local_280;
  string local_260;
  undefined1 local_23c;
  undefined1 local_23b;
  undefined1 local_23a;
  undefined1 local_239;
  undefined1 local_238 [4];
  snd_seq_addr_t receiver;
  snd_seq_addr_t sender;
  string local_218 [32];
  ostringstream local_1f8 [8];
  ostringstream ost;
  AlsaMidiData *data;
  snd_seq_port_info_t *pinfo;
  int local_50;
  uint nSrc;
  string local_40;
  string *local_20;
  string *portName_local;
  MidiOutAlsa *pMStack_10;
  uint portNumber_local;
  MidiOutAlsa *this_local;
  
  local_2a8 = (MidiApi *)this;
  local_20 = portName;
  portName_local._4_4_ = portNumber;
  pMStack_10 = this;
  if (((this->super_MidiOutApi).super_MidiApi.connected_ & 1U) == 0) {
    uStack_340 = 0x1190a8;
    local_50 = (*(this->super_MidiOutApi).super_MidiApi._vptr_MidiApi[8])();
    if (local_50 == 0) {
      local_2c8 = (string *)&local_2a8->errorString_;
      uStack_340 = 0x1190cf;
      std::__cxx11::string::operator=
                (local_2c8,"MidiOutAlsa::openPort: no MIDI output sources found!");
      local_2c0 = (string *)&pinfo;
      uStack_340 = 0x1190e6;
      std::__cxx11::string::string((string *)local_2c0,local_2c8);
      uStack_340 = 0x1190fe;
      MidiApi::error(local_2a8,NO_DEVICES_FOUND,local_2c0);
      uStack_340 = 0x119109;
      std::__cxx11::string::~string((string *)&pinfo);
    }
    else {
      uStack_340 = 0x11912f;
      lVar8 = snd_seq_port_info_sizeof();
      lVar8 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
      pinfo_00 = asStack_338 + lVar8;
      local_2d0 = pinfo_00;
      *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119157;
      __n = snd_seq_port_info_sizeof();
      __s = local_2d0;
      *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119168;
      memset(__s,0,__n);
      uVar5 = portName_local._4_4_;
      puVar1 = (undefined8 *)local_2a8->apiData_;
      seq = (snd_seq_t *)*puVar1;
      *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11918f;
      uVar5 = portInfo(seq,pinfo_00,0x42,uVar5);
      if (uVar5 == 0) {
        local_2e0 = (ostream *)local_1f8;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1191ab;
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        poVar9 = local_2e0;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1191be;
        poVar9 = std::operator<<(poVar9,"MidiOutAlsa::openPort: the \'portNumber\' argument (");
        uVar5 = portName_local._4_4_;
        local_2d8 = poVar9;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1191d6;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar5);
        local_2e8 = poVar9;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1191f2;
        std::operator<<(poVar9,") is invalid.");
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119207;
        std::__cxx11::ostringstream::str();
        psVar11 = &local_2a8->errorString_;
        local_2f8 = local_218;
        local_2f0 = (string *)psVar11;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11922e;
        std::__cxx11::string::operator=((string *)psVar11,local_218);
        psVar3 = local_2f8;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11923a;
        std::__cxx11::string::~string(psVar3);
        psVar3 = local_2f0;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11924d;
        std::__cxx11::string::string((string *)local_238,psVar3);
        pMVar4 = local_2a8;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119267;
        MidiApi::error(pMVar4,INVALID_PARAMETER,(string *)local_238);
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119275;
        std::__cxx11::string::~string((string *)local_238);
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119281;
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
      }
      else {
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1192c6;
        local_23c = snd_seq_port_info_get_client(pinfo_00);
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1192d5;
        local_23b = snd_seq_port_info_get_port(pinfo_00);
        uVar2 = *puVar1;
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1192e7;
        local_23a = snd_seq_client_id(uVar2);
        if (*(int *)((long)puVar1 + 0xc) < 0) {
          local_300 = *puVar1;
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119312;
          uVar10 = std::__cxx11::string::c_str();
          uVar2 = local_300;
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11932b;
          uVar6 = snd_seq_create_simple_port(uVar2,uVar10,0x21,0x100002);
          *(undefined4 *)((long)puVar1 + 0xc) = uVar6;
          if (*(int *)((long)puVar1 + 0xc) < 0) {
            psVar11 = &local_2a8->errorString_;
            local_310 = (string *)psVar11;
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119360;
            std::__cxx11::string::operator=
                      ((string *)psVar11,"MidiOutAlsa::openPort: ALSA error creating output port.");
            psVar3 = local_310;
            local_308 = &local_260;
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11937a;
            std::__cxx11::string::string((string *)&local_260,psVar3);
            pMVar4 = local_2a8;
            psVar11 = local_308;
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119392;
            MidiApi::error(pMVar4,DRIVER_ERROR,psVar11);
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1193a0;
            std::__cxx11::string::~string((string *)&local_260);
            return;
          }
        }
        local_239 = (undefined1)*(undefined4 *)((long)puVar1 + 0xc);
        *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1193de;
        iVar7 = snd_seq_port_subscribe_malloc(puVar1 + 2);
        if (iVar7 < 0) {
          uVar2 = puVar1[2];
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1193f4;
          snd_seq_port_subscribe_free(uVar2);
          psVar11 = &local_2a8->errorString_;
          local_320 = (string *)psVar11;
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119412;
          std::__cxx11::string::operator=
                    ((string *)psVar11,"MidiOutAlsa::openPort: error allocating port subscription.")
          ;
          psVar3 = local_320;
          local_318 = &local_280;
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11942c;
          std::__cxx11::string::string((string *)&local_280,psVar3);
          pMVar4 = local_2a8;
          psVar11 = local_318;
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119444;
          MidiApi::error(pMVar4,DRIVER_ERROR,psVar11);
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119452;
          std::__cxx11::string::~string((string *)&local_280);
        }
        else {
          uVar2 = puVar1[2];
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119488;
          snd_seq_port_subscribe_set_sender(uVar2,&local_23a);
          uVar2 = puVar1[2];
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11949c;
          snd_seq_port_subscribe_set_dest(uVar2,&local_23c);
          uVar2 = puVar1[2];
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1194ae;
          snd_seq_port_subscribe_set_time_update(uVar2,1);
          uVar2 = puVar1[2];
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1194c0;
          snd_seq_port_subscribe_set_time_real(uVar2,1);
          uVar2 = *puVar1;
          uVar10 = puVar1[2];
          *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1194d4;
          iVar7 = snd_seq_subscribe_port(uVar2,uVar10);
          if (iVar7 == 0) {
            local_2a8->connected_ = true;
          }
          else {
            uVar2 = puVar1[2];
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x1194ea;
            snd_seq_port_subscribe_free(uVar2);
            psVar11 = &local_2a8->errorString_;
            local_330 = (string *)psVar11;
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119508;
            std::__cxx11::string::operator=
                      ((string *)psVar11,"MidiOutAlsa::openPort: ALSA error making port connection."
                      );
            psVar3 = local_330;
            local_328 = &local_2a0;
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119522;
            std::__cxx11::string::string((string *)&local_2a0,psVar3);
            pMVar4 = local_2a8;
            psVar11 = local_328;
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x11953a;
            MidiApi::error(pMVar4,DRIVER_ERROR,psVar11);
            *(undefined8 *)(asStack_338 + lVar8 + -8) = 0x119548;
            std::__cxx11::string::~string((string *)&local_2a0);
          }
        }
      }
    }
  }
  else {
    local_2b8 = (string *)&(this->super_MidiOutApi).super_MidiApi.errorString_;
    uStack_340 = 0x119045;
    std::__cxx11::string::operator=
              (local_2b8,"MidiOutAlsa::openPort: a valid connection already exists!");
    local_2b0 = &local_40;
    uStack_340 = 0x11905c;
    std::__cxx11::string::string((string *)local_2b0,local_2b8);
    uStack_340 = 0x119071;
    MidiApi::error(local_2a8,WARNING,local_2b0);
    uStack_340 = 0x11907c;
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void MidiOutAlsa :: openPort( unsigned int portNumber, const std::string &portName )
{
  if ( connected_ ) {
    errorString_ = "MidiOutAlsa::openPort: a valid connection already exists!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  unsigned int nSrc = this->getPortCount();
  if ( nSrc < 1 ) {
    errorString_ = "MidiOutAlsa::openPort: no MIDI output sources found!";
    error( RtMidiError::NO_DEVICES_FOUND, errorString_ );
    return;
  }

  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, pinfo, SND_SEQ_PORT_CAP_WRITE|SND_SEQ_PORT_CAP_SUBS_WRITE, (int) portNumber ) == 0 ) {
    std::ostringstream ost;
    ost << "MidiOutAlsa::openPort: the 'portNumber' argument (" << portNumber << ") is invalid.";
    errorString_ = ost.str();
    error( RtMidiError::INVALID_PARAMETER, errorString_ );
    return;
  }

  snd_seq_addr_t sender, receiver;
  receiver.client = snd_seq_port_info_get_client( pinfo );
  receiver.port = snd_seq_port_info_get_port( pinfo );
  sender.client = snd_seq_client_id( data->seq );

  if ( data->vport < 0 ) {
    data->vport = snd_seq_create_simple_port( data->seq, portName.c_str(),
                                              SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ,
                                              SND_SEQ_PORT_TYPE_MIDI_GENERIC|SND_SEQ_PORT_TYPE_APPLICATION );
    if ( data->vport < 0 ) {
      errorString_ = "MidiOutAlsa::openPort: ALSA error creating output port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
  }

  sender.port = data->vport;

  // Make subscription
  if ( snd_seq_port_subscribe_malloc( &data->subscription ) < 0 ) {
    snd_seq_port_subscribe_free( data->subscription );
    errorString_ = "MidiOutAlsa::openPort: error allocating port subscription.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }
  snd_seq_port_subscribe_set_sender( data->subscription, &sender );
  snd_seq_port_subscribe_set_dest( data->subscription, &receiver );
  snd_seq_port_subscribe_set_time_update( data->subscription, 1 );
  snd_seq_port_subscribe_set_time_real( data->subscription, 1 );
  if ( snd_seq_subscribe_port( data->seq, data->subscription ) ) {
    snd_seq_port_subscribe_free( data->subscription );
    errorString_ = "MidiOutAlsa::openPort: ALSA error making port connection.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  connected_ = true;
}